

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void std::__sort<QList<QSettingsIniKey>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (long __first,long __last)

{
  long lVar1;
  ulong uVar2;
  
  if (__first != __last) {
    uVar2 = __last - __first >> 5;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    __introsort_loop<QList<QSettingsIniKey>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (__first,__last,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    __final_insertion_sort<QList<QSettingsIniKey>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (__first,__last);
    return;
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }